

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void * thread_specific_data(void *private_data)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  uint local_34;
  int okay;
  char *filename;
  xmlThreadParams *params;
  xmlDocPtr myDoc;
  void *private_data_local;
  
  uVar1 = *private_data;
  iVar2 = xmlCheckThreadLocalStorage();
  if (iVar2 == 0) {
    lVar3 = xmlReadFile(uVar1,0,6);
    if (lVar3 == 0) {
      printf("parse failed\n");
    }
    else {
      xmlFreeDoc(lVar3);
    }
    local_34 = (uint)(lVar3 != 0);
    *(uint *)((long)private_data + 8) = local_34;
  }
  else {
    printf("xmlCheckThreadLocalStorage failed\n");
    *(undefined4 *)((long)private_data + 8) = 0;
  }
  return (void *)0x0;
}

Assistant:

static void *
thread_specific_data(void *private_data)
{
    xmlDocPtr myDoc;
    xmlThreadParams *params = (xmlThreadParams *) private_data;
    const char *filename = params->filename;
    int okay = 1;

    if (xmlCheckThreadLocalStorage() != 0) {
        printf("xmlCheckThreadLocalStorage failed\n");
        params->okay = 0;
        return(NULL);
    }

#ifdef LIBXML_THREAD_ALLOC_ENABLED
    xmlMemSetup(xmlMemFree, xmlMemMalloc, xmlMemRealloc, xmlMemoryStrdup);
#endif

    myDoc = xmlReadFile(filename, NULL, XML_PARSE_NOENT | XML_PARSE_DTDLOAD);
    if (myDoc) {
        xmlFreeDoc(myDoc);
    } else {
        printf("parse failed\n");
        okay = 0;
    }
    params->okay = okay;
    return(NULL);
}